

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O1

bool __thiscall Clasp::Asp::SccChecker::recurse(SccChecker *this,Call *c)

{
  uint *puVar1;
  ulong uVar2;
  PrgBody *n;
  undefined8 *puVar3;
  PrgAtom *pPVar4;
  PrgNode PVar5;
  bool bVar6;
  ulong *puVar7;
  ulong *puVar8;
  long lVar9;
  ulong uVar10;
  uint *puVar11;
  uint uVar12;
  PrgAtom *a;
  ulong *puVar13;
  
  puVar13 = (ulong *)(c->node & 0xfffffffffffffffc);
  if (-1 < (long)*puVar13) {
    bk_lib::pod_vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&this->nodeStack_,&c->node);
    uVar12 = this->count_;
    this->count_ = uVar12 + 1;
    c->min = uVar12;
    *puVar13 = *puVar13 & 0x30000000ffffffff | (ulong)(uVar12 & 0xfffffff) << 0x20 |
               0x8000000000000000;
  }
  switch((uint)c->node & 3) {
  case 0:
    uVar10 = puVar13[5];
    if (c->next != (uint)uVar10) {
      uVar2 = puVar13[4];
      lVar9 = (ulong)c->next << 2;
      do {
        uVar12 = *(uint *)(uVar2 + lVar9);
        if ((((uVar12 & 2) == 0) &&
            (n = (this->prg_->bodies_).ebo_.buf[uVar12 >> 2], PVar5 = n->super_PrgNode,
            (PVar5._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar5 & 0x4000000080000000) == 0)) &&
           (bVar6 = onNode(this,&n->super_PrgNode,Body,c,(uint32)((lVar9 + uVar2) - puVar13[4] >> 2)
                          ), bVar6)) {
          return true;
        }
        lVar9 = lVar9 + 4;
      } while ((ulong)(uint)uVar10 << 2 != lVar9);
    }
    break;
  case 1:
    uVar12 = (uint)puVar13[1] & 0x6000000;
    puVar8 = puVar13 + 2;
    puVar7 = puVar8;
    if (uVar12 == 0x6000000) {
      puVar7 = *(ulong **)*puVar8;
    }
    puVar11 = (uint *)((long)puVar7 + (ulong)c->next * 4);
    if (uVar12 == 0x6000000) {
      puVar3 = (undefined8 *)*puVar8;
      puVar8 = (ulong *)*puVar3;
      uVar12 = *(uint *)(puVar3 + 1);
    }
    else {
      uVar12 = (uint)puVar13[1] >> 0x19 & 3;
    }
    puVar1 = (uint *)((long)puVar8 + (ulong)uVar12 * 4);
    if (puVar11 != puVar1) {
      lVar9 = (long)puVar7 + (ulong)c->next * 4;
      do {
        bVar6 = (*puVar11 & 0xc) != 0;
        pPVar4 = (&this->prg_->atoms_)[bVar6].ebo_.buf[*puVar11 >> 4];
        PVar5 = (pPVar4->super_PrgHead).super_PrgNode;
        if ((PVar5._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar5 & 0x4000000080000000) == 0) {
          puVar8 = puVar13 + 2;
          if ((~(uint)puVar13[1] & 0x6000000) == 0) {
            puVar8 = *(ulong **)puVar13[2];
          }
          bVar6 = onNode(this,(PrgNode *)pPVar4,(uint)bVar6 * 2,c,
                         (uint32)((ulong)(lVar9 - (long)puVar8) >> 2));
          if (bVar6) {
            return true;
          }
        }
        puVar11 = puVar11 + 1;
        lVar9 = lVar9 + 4;
      } while (puVar11 != puVar1);
    }
    break;
  case 2:
    uVar12 = (uint)puVar13[3] & 0x7ffffff;
    if (c->next != uVar12) {
      uVar10 = (ulong)c->next << 2;
      do {
        pPVar4 = (this->prg_->atoms_).ebo_.buf[*(uint *)((long)puVar13 + uVar10 + 0x1c)];
        PVar5 = (pPVar4->super_PrgHead).super_PrgNode;
        if (((PVar5._0_4_ & 0x7fffffff) != 1 && ((ulong)PVar5 & 0x4000000080000000) == 0) &&
           (bVar6 = onNode(this,(PrgNode *)pPVar4,Atom,c,(uint32)(uVar10 >> 2)), bVar6)) {
          return true;
        }
        uVar10 = uVar10 + 4;
      } while (uVar12 << 2 != uVar10);
    }
  }
  return false;
}

Assistant:

bool SccChecker::recurse(Call& c) {
	PrgNode* n = unpackNode(c.node);
	if (!n->seen()) {
		nodeStack_.push_back(c.node);
		c.min = count_++;
		n->resetId(c.min, true);
	}
	if (isNode(c.node, PrgNode::Body)) {
		PrgBody* b = static_cast<PrgBody*>(n);
		PrgHead* h = 0; NodeType t;
		for (PrgBody::head_iterator it = b->heads_begin() + c.next, end = b->heads_end(); it != end; ++it) {
			if   (it->isAtom()){ h = prg_->getAtom(it->node()); t = PrgNode::Atom; }
			else               { h = prg_->getDisj(it->node()); t = PrgNode::Disj; }
			if (doVisit(h, false) && onNode(h, t, c, static_cast<uint32>(it-b->heads_begin()))) {
				return true;
			}
		}
	}
	else if (isNode(c.node, PrgNode::Atom)) {
		PrgAtom* a = static_cast<PrgAtom*>(n);
		for (PrgAtom::dep_iterator it = a->deps_begin() + c.next, end = a->deps_end(); it != end; ++it) {
			if (it->sign()) continue;
			PrgBody* bn = prg_->getBody(it->var());
			if (doVisit(bn, false) && onNode(bn, PrgNode::Body, c, static_cast<uint32>(it-a->deps_begin()))) {
				return true;
			}
		}
	}
	else if (isNode(c.node, PrgNode::Disj)) {
		PrgDisj* d = static_cast<PrgDisj*>(n);
		for (PrgDisj::atom_iterator it = d->begin() + c.next, end = d->end(); it != end; ++it) {
			PrgAtom* a = prg_->getAtom(*it);
			if (doVisit(a, false) && onNode(a, PrgNode::Atom, c, static_cast<uint32>(it-d->begin()))) {
				return true;
			}
		}
	}
	return false;
}